

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O0

DFsSection * __thiscall DFsScript::FindSectionEnd(DFsScript *this,char *brace)

{
  char *pcVar1;
  DFsSection *local_30;
  DFsSection *current;
  int n;
  char *brace_local;
  DFsScript *this_local;
  
  current._4_4_ = 0;
  do {
    if (0x10 < current._4_4_) {
      return (DFsSection *)0x0;
    }
    for (local_30 = ::TObjPtr::operator_cast_to_DFsSection_
                              ((TObjPtr *)(this->sections + current._4_4_));
        local_30 != (DFsSection *)0x0;
        local_30 = ::TObjPtr::operator_cast_to_DFsSection_((TObjPtr *)&local_30->next)) {
      pcVar1 = SectionEnd(this,local_30);
      if (pcVar1 == brace) {
        return local_30;
      }
    }
    current._4_4_ = current._4_4_ + 1;
  } while( true );
}

Assistant:

DFsSection *DFsScript::FindSectionEnd(const char *brace)
{
	int n;
	
	// hash table is no use, they are hashed according to
	// the offset of the starting brace
	
	// we have to go through every entry to find from the
	// ending brace
	
	for(n=0; n<SECTIONSLOTS; n++)      // check all sections in all chains
	{
		DFsSection *current = sections[n];
		
		while(current)
		{
			if(SectionEnd(current) == brace) return current;        // found it
			current = current->next;
		}
	}
	return NULL;    // not found
}